

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg>::
emplace_back<slang::ast::Expression_const&>
          (SmallVectorBase<slang::ast::SystemTimingCheckSymbol::Arg> *this,Expression *args)

{
  undefined8 *puVar1;
  ulong uVar2;
  pointer p;
  Expression *pEVar3;
  Expression *pEVar4;
  pointer paVar5;
  undefined4 uVar6;
  pointer pAVar7;
  long lVar8;
  pointer pAVar9;
  pointer pAVar10;
  long lVar11;
  pointer __src;
  size_type sVar12;
  ulong uVar13;
  
  __src = this->data_ + this->len;
  if (this->len != this->cap) {
    __src->expr = args;
    __src->condition = (Expression *)0x0;
    __src->edge = None;
    (__src->edgeDescriptors)._M_ptr = (pointer)0x0;
    (__src->edgeDescriptors)._M_extent._M_extent_value = 0;
    sVar12 = this->len;
    this->len = sVar12 + 1;
    return this->data_ + sVar12;
  }
  if (this->len == 0x333333333333333) {
    detail::throwLengthError();
  }
  uVar13 = this->len + 1;
  uVar2 = this->cap;
  if (uVar13 < uVar2 * 2) {
    uVar13 = uVar2 * 2;
  }
  if (0x333333333333333 - uVar2 < uVar2) {
    uVar13 = 0x333333333333333;
  }
  lVar11 = (long)__src - (long)this->data_;
  pAVar7 = (pointer)operator_new(uVar13 * 0x28);
  *(Expression **)((long)pAVar7 + lVar11) = args;
  *(undefined8 *)((long)pAVar7 + lVar11 + 8) = 0;
  *(undefined4 *)((long)pAVar7 + lVar11 + 0x10) = 0;
  puVar1 = (undefined8 *)((long)pAVar7 + lVar11 + 0x18);
  *puVar1 = 0;
  puVar1[1] = 0;
  p = this->data_;
  sVar12 = this->len;
  lVar8 = (long)p + (sVar12 * 0x28 - (long)__src);
  pAVar9 = p;
  pAVar10 = pAVar7;
  if (lVar8 == 0) {
    pAVar9 = pAVar7;
    pAVar10 = p;
    if (sVar12 != 0) {
      do {
        (pAVar9->edgeDescriptors)._M_extent._M_extent_value =
             (pAVar10->edgeDescriptors)._M_extent._M_extent_value;
        pEVar3 = pAVar10->expr;
        pEVar4 = pAVar10->condition;
        uVar6 = *(undefined4 *)&pAVar10->field_0x14;
        paVar5 = (pAVar10->edgeDescriptors)._M_ptr;
        pAVar9->edge = pAVar10->edge;
        *(undefined4 *)&pAVar9->field_0x14 = uVar6;
        (pAVar9->edgeDescriptors)._M_ptr = paVar5;
        pAVar9->expr = pEVar3;
        pAVar9->condition = pEVar4;
        pAVar10 = pAVar10 + 1;
        pAVar9 = pAVar9 + 1;
      } while (pAVar10 != __src);
    }
  }
  else {
    for (; pAVar9 != __src; pAVar9 = pAVar9 + 1) {
      (pAVar10->edgeDescriptors)._M_extent._M_extent_value =
           (pAVar9->edgeDescriptors)._M_extent._M_extent_value;
      pEVar3 = pAVar9->expr;
      pEVar4 = pAVar9->condition;
      uVar6 = *(undefined4 *)&pAVar9->field_0x14;
      paVar5 = (pAVar9->edgeDescriptors)._M_ptr;
      pAVar10->edge = pAVar9->edge;
      *(undefined4 *)&pAVar10->field_0x14 = uVar6;
      (pAVar10->edgeDescriptors)._M_ptr = paVar5;
      pAVar10->expr = pEVar3;
      pAVar10->condition = pEVar4;
      pAVar10 = pAVar10 + 1;
    }
    memcpy((void *)((long)pAVar7 + lVar11 + 0x28),__src,((lVar8 - 0x28U) / 0x28) * 0x28 + 0x28);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar12 = this->len;
  }
  this->len = sVar12 + 1;
  this->cap = uVar13;
  this->data_ = pAVar7;
  return (reference)((long)pAVar7 + lVar11);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }